

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWLookat.h
# Opt level: O2

int __thiscall
COLLADAFW::Lookat::clone(Lookat *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Lookat *this_00;
  
  this_00 = (Lookat *)operator_new(0x70);
  Lookat(this_00,this);
  return (int)this_00;
}

Assistant:

virtual Lookat* clone() const { return new Lookat(*this); }